

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O2

void QPermissions::Private::requestPermission(QPermission *permission,PermissionCallback *callback)

{
  QDebug *pQVar1;
  long in_FS_OFFSET;
  QMessageLogger local_38;
  
  local_38.context.category = *(char **)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::lcPermissions();
  if (((byte)QtPrivateLogging::lcPermissions::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    QMessageLogger::debug(&local_38);
    pQVar1 = QDebug::operator<<((QDebug *)&local_38,"No permission backend on this platform.");
    pQVar1 = QDebug::operator<<(pQVar1,"Optimistically returning Granted for");
    local_38.context.file = (char *)pQVar1->stream;
    ((Stream *)local_38.context.file)->ref = ((Stream *)local_38.context.file)->ref + 1;
    ::operator<<((QDebug)&local_38.context.function,(QPermission *)&local_38.context.file);
    QDebug::~QDebug((QDebug *)&local_38.context.function);
    QDebug::~QDebug((QDebug *)&local_38.context.file);
    QDebug::~QDebug((QDebug *)&local_38);
  }
  std::function<void_(Qt::PermissionStatus)>::operator()(callback,Granted);
  if (*(char **)(in_FS_OFFSET + 0x28) == local_38.context.category) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void requestPermission(const QPermission &permission, const PermissionCallback &callback)
    {
        qCDebug(lcPermissions) << "No permission backend on this platform."
            << "Optimistically returning Granted for" << permission;
        callback(Qt::PermissionStatus::Granted);
    }